

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *psVar3;
  size_type *psVar4;
  Enum EVar5;
  ulong uVar6;
  ctrl_t *pcVar7;
  slot_type *psVar8;
  pointer pcVar9;
  slot_type *psVar10;
  ulong *puVar11;
  size_type sVar12;
  undefined1 auVar13 [16];
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined8 uVar29;
  size_type sVar30;
  ctrl_t *pcVar31;
  size_t sVar32;
  ulong uVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  ulong uVar36;
  byte bVar37;
  size_t i;
  FindInfo FVar38;
  ulong *puStack_50;
  ulong uStack_40;
  ulong uStack_38;
  
  uVar6 = this->capacity_;
  if (uVar6 == 0) {
    resize(this,1);
    return;
  }
  if ((uVar6 + 1 & uVar6) != 0) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x248,"size_t phmap::priv::CapacityToGrowth(size_t)");
  }
  if (uVar6 - (uVar6 >> 3) >> 1 < this->size_) {
    resize(this,uVar6 * 2 + 1);
    return;
  }
  uVar6 = this->capacity_;
  if ((uVar6 == 0) || ((uVar6 + 1 & uVar6) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
                 );
  }
  if (uVar6 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
                 );
  }
  pcVar7 = this->ctrl_;
  if (pcVar7[uVar6] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x230,
                  "void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *__restrict, size_t)"
                 );
  }
  pcVar31 = pcVar7 + uVar6;
  if (pcVar31 + 1 != pcVar7) {
    uVar36 = 0;
    do {
      pcVar1 = pcVar7 + uVar36;
      cVar14 = pcVar1[1];
      cVar15 = pcVar1[2];
      cVar16 = pcVar1[3];
      cVar17 = pcVar1[4];
      cVar18 = pcVar1[5];
      cVar19 = pcVar1[6];
      cVar20 = pcVar1[7];
      cVar21 = pcVar1[8];
      cVar22 = pcVar1[9];
      cVar23 = pcVar1[10];
      cVar24 = pcVar1[0xb];
      cVar25 = pcVar1[0xc];
      cVar26 = pcVar1[0xd];
      cVar27 = pcVar1[0xe];
      cVar28 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar7 + uVar36);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar24 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar25 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar26 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar27 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar28 < '\0') & 0x7eU ^ 0xfe;
      uVar36 = uVar36 + 0x10;
    } while (uVar6 + 1 != uVar36);
  }
  uVar29 = *(undefined8 *)(pcVar7 + 8);
  *(undefined8 *)(pcVar31 + 1) = *(undefined8 *)pcVar7;
  *(undefined8 *)(pcVar31 + 9) = uVar29;
  *pcVar31 = -1;
  sVar32 = this->capacity_;
  if (sVar32 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        auVar13 = ZEXT416(this->slots_[i].value.first) * ZEXT816(0xde5fb9d2630458e9);
        uVar36 = auVar13._8_8_ + auVar13._0_8_;
        FVar38 = find_first_non_full(this,uVar36);
        sVar32 = FVar38.offset;
        uVar6 = this->capacity_;
        if ((uVar6 + 1 & uVar6) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar33 = uVar36 >> 7 & uVar6;
        bVar37 = (byte)uVar36;
        if (((i - uVar33 ^ sVar32 - uVar33) & uVar6) < 0x10) {
          bVar37 = bVar37 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar32] == -2) {
            set_ctrl(this,sVar32,bVar37 & 0x7f);
            psVar10 = this->slots_;
            psVar3 = psVar10 + i;
            paVar34 = &(psVar3->value).second.field_2;
            EVar5 = (psVar3->value).first;
            puStack_50 = &uStack_40;
            puVar11 = (ulong *)(psVar3->value).second._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar11 == paVar34) {
              uStack_40 = paVar34->_M_allocated_capacity;
              uStack_38 = *(ulong *)((long)&(psVar3->value).second.field_2 + 8);
            }
            else {
              uStack_40 = paVar34->_M_allocated_capacity;
              puStack_50 = puVar11;
            }
            sVar12 = (&psVar10->value)[i].second._M_string_length;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)psVar10 + i * 0x28 + 8) = paVar34;
            (&psVar10->value)[i].second._M_string_length = 0;
            (&psVar10->value)[i].second.field_2._M_local_buf[0] = '\0';
            psVar10 = this->slots_;
            psVar3 = psVar10 + i;
            psVar4 = (size_type *)((long)psVar10 + sVar32 * 0x28 + 0x18);
            (psVar3->value).first = *(Enum *)(psVar4 + -3);
            paVar34 = &(&psVar10->value)[i].second.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)psVar10 + i * 0x28 + 8) = paVar34;
            if ((size_type *)psVar4[-2] == psVar4) {
              sVar30 = psVar4[1];
              paVar34->_M_allocated_capacity = *psVar4;
              *(size_type *)((long)&(&psVar10->value)[i].second.field_2 + 8) = sVar30;
            }
            else {
              (psVar3->value).second._M_dataplus._M_p = (pointer)psVar4[-2];
              (psVar3->value).second.field_2._M_allocated_capacity = *psVar4;
            }
            (psVar3->value).second._M_string_length =
                 (&psVar10->value)[sVar32].second._M_string_length;
            *(size_type **)((long)psVar10 + sVar32 * 0x28 + 8) = psVar4;
            (&psVar10->value)[sVar32].second._M_string_length = 0;
            (&psVar10->value)[sVar32].second.field_2._M_local_buf[0] = '\0';
            psVar10 = this->slots_;
            psVar3 = psVar10 + sVar32;
            (psVar3->value).first = EVar5;
            puVar11 = (ulong *)((long)psVar10 + sVar32 * 0x28 + 0x18);
            puVar11[-2] = (ulong)puVar11;
            if (puStack_50 == &uStack_40) {
              *puVar11 = uStack_40;
              puVar11[1] = uStack_38;
            }
            else {
              (psVar3->value).second._M_dataplus._M_p = (pointer)puStack_50;
              (psVar3->value).second.field_2._M_allocated_capacity = uStack_40;
            }
            (psVar3->value).second._M_string_length = sVar12;
            uStack_40 = uStack_40 & 0xffffffffffffff00;
            i = i - 1;
            goto LAB_00180daf;
          }
          if (this->ctrl_[sVar32] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x853,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
                         );
          }
          set_ctrl(this,sVar32,bVar37 & 0x7f);
          psVar8 = this->slots_;
          psVar3 = psVar8 + sVar32;
          psVar10 = psVar8 + i;
          paVar34 = &(psVar10->value).second.field_2;
          (psVar3->value).first = (psVar10->value).first;
          paVar35 = &(&psVar8->value)[sVar32].second.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)((long)psVar8 + sVar32 * 0x28 + 8) = paVar35;
          pcVar9 = (psVar10->value).second._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar9 == paVar34) {
            uVar29 = *(undefined8 *)((long)&(psVar10->value).second.field_2 + 8);
            paVar35->_M_allocated_capacity = paVar34->_M_allocated_capacity;
            *(undefined8 *)((long)&(&psVar8->value)[sVar32].second.field_2 + 8) = uVar29;
          }
          else {
            (psVar3->value).second._M_dataplus._M_p = pcVar9;
            (psVar3->value).second.field_2._M_allocated_capacity = paVar34->_M_allocated_capacity;
          }
          (psVar3->value).second._M_string_length = (&psVar8->value)[i].second._M_string_length;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)((long)psVar8 + i * 0x28 + 8) = paVar34;
          (&psVar8->value)[i].second._M_string_length = 0;
          (&psVar8->value)[i].second.field_2._M_local_buf[0] = '\0';
          bVar37 = 0x80;
        }
        set_ctrl(this,i,bVar37);
      }
LAB_00180daf:
      i = i + 1;
      sVar32 = this->capacity_;
    } while (i != sVar32);
  }
  reset_growth_left(this,sVar32);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }